

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reference.cc
# Opt level: O0

PassDef * verona::reference(void)

{
  PassDef *in_RDI;
  pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>
  *local_1bd0;
  DebugLocation local_1b80;
  Token local_1b78;
  Pattern local_1b70;
  Pattern local_1af8;
  Token local_1a80;
  Token local_1a78;
  Pattern local_1a70;
  Pattern local_19f8;
  Token local_1980;
  Token local_1978;
  Pattern local_1970;
  Pattern local_18f8;
  Token local_1880;
  Pattern local_1878;
  Pattern local_1800;
  Pattern local_1788;
  Pattern local_1710;
  Located<trieste::detail::Pattern> local_1698;
  undefined **local_1610;
  DebugLocation local_1608;
  Token local_1600;
  Token local_15f8;
  Pattern local_15f0;
  Pattern local_1578;
  Token local_1500;
  Pattern local_14f8;
  Pattern local_1480;
  Located<trieste::detail::Pattern> local_1408;
  undefined **local_1380;
  DebugLocation local_1378;
  Token local_1370;
  Token local_1368;
  Pattern local_1360;
  Pattern local_12e8;
  Pattern local_1270;
  Token local_11f8;
  Token local_11f0;
  Token local_11e8;
  Pattern local_11e0;
  Pattern local_1168;
  Token local_10f0;
  Token local_10e8;
  Token local_10e0;
  Pattern local_10d8;
  Pattern local_1060;
  Token local_fe8;
  Pattern local_fe0;
  Pattern local_f68;
  Pattern local_ef0;
  Pattern local_e78;
  Located<trieste::detail::Pattern> local_e00;
  undefined **local_d78;
  DebugLocation local_d70;
  Token local_d68;
  Token local_d60;
  Pattern local_d58;
  Pattern local_ce0;
  Token local_c68;
  Token local_c60;
  Pattern local_c58;
  Pattern local_be0;
  Token local_b68;
  Pattern local_b60;
  Pattern local_ae8;
  Pattern local_a70;
  Located<trieste::detail::Pattern> local_9f8;
  undefined **local_970;
  DebugLocation local_968;
  Token local_960;
  Token local_958;
  Pattern local_950;
  Pattern local_8d8;
  Pattern local_860;
  Token local_7e8;
  Token local_7e0;
  Pattern local_7d8;
  Pattern local_760;
  Token local_6e8;
  Token local_6e0;
  Pattern local_6d8;
  Pattern local_660;
  Token local_5e8;
  Pattern local_5e0;
  Pattern local_568;
  Pattern local_4f0;
  Pattern local_478;
  Located<trieste::detail::Pattern> local_400;
  pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>
  *local_380;
  pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>
  local_378;
  undefined1 local_2d8 [160];
  undefined1 local_238 [160];
  undefined1 local_198 [160];
  undefined1 local_f8 [160];
  undefined1 local_58 [40];
  string local_30;
  
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"reference",(allocator<char> *)(local_58 + 0x27));
  local_380 = &local_378;
  trieste::Token::Token(&local_5e8,(TokenDef *)Expr);
  trieste::In<>(&local_5e0,&local_5e8);
  trieste::Token::Token(&local_6e0,(TokenDef *)LLVM);
  trieste::T(&local_6d8,&local_6e0);
  trieste::Token::Token(&local_6e8,(TokenDef *)LLVM);
  trieste::detail::Pattern::operator[](&local_660,&local_6d8,&local_6e8);
  trieste::detail::Pattern::operator*(&local_568,&local_5e0,&local_660);
  trieste::Token::Token(&local_7e0,(TokenDef *)Ident);
  trieste::T(&local_7d8,&local_7e0);
  trieste::Token::Token(&local_7e8,(TokenDef *)Lhs);
  trieste::detail::Pattern::operator[](&local_760,&local_7d8,&local_7e8);
  trieste::detail::Pattern::operator*(&local_4f0,&local_568,&local_760);
  trieste::Token::Token(&local_958,(TokenDef *)Ident);
  trieste::T(&local_950,&local_958);
  trieste::detail::Pattern::operator++(&local_8d8,&local_950,0);
  trieste::Token::Token(&local_960,(TokenDef *)Rhs);
  trieste::detail::Pattern::operator[](&local_860,&local_8d8,&local_960);
  trieste::detail::Pattern::operator*(&local_478,&local_4f0,&local_860);
  local_970 = &PTR_s__workspace_llm4binary_github_lic_0049c0b0;
  trieste::detail::DebugLocation::DebugLocation(&local_968,(source_location)0x49c0b0);
  trieste::detail::Located<trieste::detail::Pattern>::Located(&local_400,&local_478,local_968);
  trieste::
  operator>><(lambda_at__workspace_llm4binary_github_license_c_cmakelists_microsoft[P]verona_src_passes_reference_cc:18:11)>
            (&local_378,&local_400);
  local_380 = (pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>
               *)local_2d8;
  trieste::Token::Token(&local_b68,(TokenDef *)Expr);
  trieste::In<>(&local_b60,&local_b68);
  trieste::Token::Token(&local_c60,(TokenDef *)LLVM);
  trieste::T(&local_c58,&local_c60);
  trieste::Token::Token(&local_c68,(TokenDef *)Lhs);
  trieste::detail::Pattern::operator[](&local_be0,&local_c58,&local_c68);
  trieste::detail::Pattern::operator*(&local_ae8,&local_b60,&local_be0);
  trieste::Token::Token(&local_d60,(TokenDef *)LLVM);
  trieste::T(&local_d58,&local_d60);
  trieste::Token::Token(&local_d68,(TokenDef *)Rhs);
  trieste::detail::Pattern::operator[](&local_ce0,&local_d58,&local_d68);
  trieste::detail::Pattern::operator*(&local_a70,&local_ae8,&local_ce0);
  local_d78 = &PTR_s__workspace_llm4binary_github_lic_0049c0c8;
  trieste::detail::DebugLocation::DebugLocation(&local_d70,(source_location)0x49c0c8);
  trieste::detail::Located<trieste::detail::Pattern>::Located(&local_9f8,&local_a70,local_d70);
  trieste::
  operator>><(lambda_at__workspace_llm4binary_github_license_c_cmakelists_microsoft[P]verona_src_passes_reference_cc:32:11)>
            (local_2d8,&local_9f8);
  local_380 = (pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>
               *)local_238;
  trieste::Token::Token(&local_fe8,(TokenDef *)Expr);
  trieste::In<>(&local_fe0,&local_fe8);
  trieste::Token::Token(&local_10e0,(TokenDef *)Dot);
  trieste::Token::Token(&local_10e8,(TokenDef *)DoubleColon);
  trieste::T<>(&local_10d8,&local_10e0,&local_10e8);
  trieste::Token::Token(&local_10f0,(TokenDef *)Dot);
  trieste::detail::Pattern::operator[](&local_1060,&local_10d8,&local_10f0);
  trieste::detail::Pattern::operator*(&local_f68,&local_fe0,&local_1060);
  trieste::Token::Token(&local_11e8,(TokenDef *)Ident);
  trieste::Token::Token(&local_11f0,(TokenDef *)Symbol);
  trieste::T<>(&local_11e0,&local_11e8,&local_11f0);
  trieste::Token::Token(&local_11f8,(TokenDef *)Ident);
  trieste::detail::Pattern::operator[](&local_1168,&local_11e0,&local_11f8);
  trieste::detail::Pattern::operator*(&local_ef0,&local_f68,&local_1168);
  trieste::Token::Token(&local_1368,(TokenDef *)TypeArgs);
  trieste::T(&local_1360,&local_1368);
  trieste::Token::Token(&local_1370,(TokenDef *)TypeArgs);
  trieste::detail::Pattern::operator[](&local_12e8,&local_1360,&local_1370);
  trieste::detail::Pattern::operator~(&local_1270,&local_12e8);
  trieste::detail::Pattern::operator*(&local_e78,&local_ef0,&local_1270);
  local_1380 = &PTR_s__workspace_llm4binary_github_lic_0049c0e0;
  trieste::detail::DebugLocation::DebugLocation(&local_1378,(source_location)0x49c0e0);
  trieste::detail::Located<trieste::detail::Pattern>::Located(&local_e00,&local_e78,local_1378);
  trieste::
  operator>><(lambda_at__workspace_llm4binary_github_license_c_cmakelists_microsoft[P]verona_src_passes_reference_cc:44:11)>
            (local_238,&local_e00);
  local_380 = (pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>
               *)local_198;
  trieste::Token::Token(&local_1500,(TokenDef *)Expr);
  trieste::In<>(&local_14f8,&local_1500);
  trieste::Token::Token(&local_15f8,(TokenDef *)Ident);
  trieste::T(&local_15f0,&local_15f8);
  trieste::Token::Token(&local_1600,(TokenDef *)Ident);
  trieste::detail::Pattern::operator[](&local_1578,&local_15f0,&local_1600);
  trieste::detail::Pattern::operator*(&local_1480,&local_14f8,&local_1578);
  local_1610 = &PTR_s__workspace_llm4binary_github_lic_0049c0f8;
  trieste::detail::DebugLocation::DebugLocation(&local_1608,(source_location)0x49c0f8);
  trieste::detail::Located<trieste::detail::Pattern>::Located(&local_1408,&local_1480,local_1608);
  trieste::
  operator>><(lambda_at__workspace_llm4binary_github_license_c_cmakelists_microsoft[P]verona_src_passes_reference_cc:49:40)>
            (local_198,&local_1408);
  local_380 = (pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>
               *)local_f8;
  trieste::Token::Token(&local_1880,(TokenDef *)Expr);
  trieste::In<>(&local_1878,&local_1880);
  trieste::Token::Token(&local_1978,(TokenDef *)Try);
  trieste::T(&local_1970,&local_1978);
  trieste::Token::Token(&local_1980,(TokenDef *)Try);
  trieste::detail::Pattern::operator[](&local_18f8,&local_1970,&local_1980);
  trieste::detail::Pattern::operator*(&local_1800,&local_1878,&local_18f8);
  trieste::Token::Token(&local_1a78,(TokenDef *)Lambda);
  trieste::T(&local_1a70,&local_1a78);
  trieste::Token::Token(&local_1a80,(TokenDef *)Lambda);
  trieste::detail::Pattern::operator[](&local_19f8,&local_1a70,&local_1a80);
  trieste::detail::Pattern::operator*(&local_1788,&local_1800,&local_19f8);
  trieste::Token::Token(&local_1b78,(TokenDef *)Dot);
  trieste::T(&local_1b70,&local_1b78);
  trieste::detail::Pattern::operator--(&local_1af8,&local_1b70);
  trieste::detail::Pattern::operator*(&local_1710,&local_1788,&local_1af8);
  trieste::detail::DebugLocation::DebugLocation(&local_1b80,(source_location)0x49c110);
  trieste::detail::Located<trieste::detail::Pattern>::Located(&local_1698,&local_1710,local_1b80);
  trieste::
  operator>><(lambda_at__workspace_llm4binary_github_license_c_cmakelists_microsoft[P]verona_src_passes_reference_cc:62:11)>
            (local_f8,&local_1698);
  local_58._0_8_ = &local_378;
  local_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x5;
  trieste::PassDef::PassDef
            (in_RDI,&local_30,(Wellformed *)wfPassReference,2,
             (initializer_list<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>
              *)local_58);
  local_1bd0 = (pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>
                *)local_58;
  do {
    local_1bd0 = local_1bd0 + -1;
    ::std::
    pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>
    ::~pair(local_1bd0);
  } while (local_1bd0 != &local_378);
  trieste::detail::Located<trieste::detail::Pattern>::~Located(&local_1698);
  trieste::detail::Pattern::~Pattern(&local_1710);
  trieste::detail::Pattern::~Pattern(&local_1af8);
  trieste::detail::Pattern::~Pattern(&local_1b70);
  trieste::detail::Pattern::~Pattern(&local_1788);
  trieste::detail::Pattern::~Pattern(&local_19f8);
  trieste::detail::Pattern::~Pattern(&local_1a70);
  trieste::detail::Pattern::~Pattern(&local_1800);
  trieste::detail::Pattern::~Pattern(&local_18f8);
  trieste::detail::Pattern::~Pattern(&local_1970);
  trieste::detail::Pattern::~Pattern(&local_1878);
  trieste::detail::Located<trieste::detail::Pattern>::~Located(&local_1408);
  trieste::detail::Pattern::~Pattern(&local_1480);
  trieste::detail::Pattern::~Pattern(&local_1578);
  trieste::detail::Pattern::~Pattern(&local_15f0);
  trieste::detail::Pattern::~Pattern(&local_14f8);
  trieste::detail::Located<trieste::detail::Pattern>::~Located(&local_e00);
  trieste::detail::Pattern::~Pattern(&local_e78);
  trieste::detail::Pattern::~Pattern(&local_1270);
  trieste::detail::Pattern::~Pattern(&local_12e8);
  trieste::detail::Pattern::~Pattern(&local_1360);
  trieste::detail::Pattern::~Pattern(&local_ef0);
  trieste::detail::Pattern::~Pattern(&local_1168);
  trieste::detail::Pattern::~Pattern(&local_11e0);
  trieste::detail::Pattern::~Pattern(&local_f68);
  trieste::detail::Pattern::~Pattern(&local_1060);
  trieste::detail::Pattern::~Pattern(&local_10d8);
  trieste::detail::Pattern::~Pattern(&local_fe0);
  trieste::detail::Located<trieste::detail::Pattern>::~Located(&local_9f8);
  trieste::detail::Pattern::~Pattern(&local_a70);
  trieste::detail::Pattern::~Pattern(&local_ce0);
  trieste::detail::Pattern::~Pattern(&local_d58);
  trieste::detail::Pattern::~Pattern(&local_ae8);
  trieste::detail::Pattern::~Pattern(&local_be0);
  trieste::detail::Pattern::~Pattern(&local_c58);
  trieste::detail::Pattern::~Pattern(&local_b60);
  trieste::detail::Located<trieste::detail::Pattern>::~Located(&local_400);
  trieste::detail::Pattern::~Pattern(&local_478);
  trieste::detail::Pattern::~Pattern(&local_860);
  trieste::detail::Pattern::~Pattern(&local_8d8);
  trieste::detail::Pattern::~Pattern(&local_950);
  trieste::detail::Pattern::~Pattern(&local_4f0);
  trieste::detail::Pattern::~Pattern(&local_760);
  trieste::detail::Pattern::~Pattern(&local_7d8);
  trieste::detail::Pattern::~Pattern(&local_568);
  trieste::detail::Pattern::~Pattern(&local_660);
  trieste::detail::Pattern::~Pattern(&local_6d8);
  trieste::detail::Pattern::~Pattern(&local_5e0);
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::allocator<char>::~allocator((allocator<char> *)(local_58 + 0x27));
  return in_RDI;
}

Assistant:

PassDef reference()
  {
    return {
      "reference",
      wfPassReference,
      dir::topdown,
      {
        // LLVM literal.
        In(Expr) * T(LLVM)[LLVM] * T(Ident)[Lhs] * T(Ident)++[Rhs] >>
          [](Match& _) {
            auto rhs = _[Rhs];
            auto s = std::string()
                       .append(_(LLVM)->location().view())
                       .append(" %")
                       .append(_(Lhs)->location().view());

            for (auto& i = rhs.first; i != rhs.second; ++i)
              s.append(", %").append((*i)->location().view());

            return LLVM ^ s;
          },

        In(Expr) * T(LLVM)[Lhs] * T(LLVM)[Rhs] >>
          [](Match& _) {
            return LLVM ^
              std::string()
                .append(_(Lhs)->location().view())
                .append(" ")
                .append(_(Rhs)->location().view());
          },

        // Dot and DoubleColon notation. Use `Ident` as a selector, even if it's
        // in scope.
        In(Expr) * T(Dot, DoubleColon)[Dot] * T(Ident, Symbol)[Ident] *
            ~T(TypeArgs)[TypeArgs] >>
          [](Match& _) {
            return Seq << _(Dot) << selector(_(Ident), _(TypeArgs));
          },

        // Local reference.
        In(Expr) * T(Ident)[Ident] >> ([](Match& _) -> Node {
          auto id = _(Ident);

          if (lookup_type(id, {Var}))
            return RefVar << id;
          else if (lookup_type(id, {Let, Param}))
            return RefLet << id;

          return NoChange;
        }),

        // Given `try { ... }`, apply the lambda.
        In(Expr) * T(Try)[Try] * T(Lambda)[Lambda] * --T(Dot) >>
          [](Match& _) {
            return Seq << Try << _(Lambda) << Dot << selector(l_apply);
          },
      }};
  }